

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O3

void __thiscall
QItemSelectionModelPrivate::rowsAboutToBeRemoved
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *pQVar1;
  QPersistentModelIndex *pQVar2;
  QObject *sender;
  QPersistentModelIndexData *pQVar3;
  QPersistentModelIndexData *pQVar4;
  undefined8 uVar5;
  Data *pDVar6;
  bool bVar7;
  int iVar8;
  parameter_type pQVar9;
  iterator abegin;
  iterator iVar10;
  uint uVar11;
  uint uVar12;
  undefined4 in_register_00000014;
  QAbstractItemModel *pQVar13;
  QItemSelection *this_00;
  long in_FS_OFFSET;
  QModelIndex local_108;
  QItemSelectionRange local_e8;
  QModelIndex local_d0;
  QModelIndex local_b8;
  QArrayDataPointer<QItemSelectionRange> local_98;
  QArrayDataPointer<QItemSelectionRange> local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  this_00 = &this->ranges;
  QItemSelection::merge
            (this_00,&this->currentSelection,
             (SelectionFlags)
             (this->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>
             .super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if ((this->currentSelection).super_QList<QItemSelectionRange>.d.size != 0) {
    QList<QItemSelectionRange>::clear(&(this->currentSelection).super_QList<QItemSelectionRange>);
  }
  pQVar2 = &this->currentIndex;
  bVar7 = QPersistentModelIndex::isValid(pQVar2);
  if (!bVar7) goto LAB_0045a7aa;
  QPersistentModelIndex::parent(&local_58,pQVar2);
  if (((((parent->r != local_58.r) || (parent->c != local_58.c)) ||
       ((QItemSelectionRange *)parent->i != (QItemSelectionRange *)local_58.i)) ||
      (((QArrayDataPointer<QItemSelectionRange> *)(parent->m).ptr !=
        (QArrayDataPointer<QItemSelectionRange> *)local_58.m.ptr ||
       (iVar8 = QPersistentModelIndex::row(pQVar2), iVar8 < start)))) ||
     (iVar8 = QPersistentModelIndex::row(pQVar2), end < iVar8)) goto LAB_0045a7aa;
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
  if (start < 1) {
    pQVar1 = &this->model;
    pQVar9 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             ::value(pQVar1);
    if (pQVar9 != (parameter_type)0x0) {
      QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
      ::value(pQVar1);
      pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
      iVar8 = (*(pQVar13->super_QObject)._vptr_QObject[0xf])(pQVar13,parent);
      if (end < iVar8 + -1) {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar12 = end + 1;
        goto LAB_0045a65c;
      }
    }
    local_58._0_8_ = (Data *)0xffffffffffffffff;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(&this->model);
    pQVar13 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
    uVar12 = start - 1;
LAB_0045a65c:
    (*(pQVar13->super_QObject)._vptr_QObject[0xc])
              (&local_58,pQVar13,(ulong)uVar12,(ulong)local_78.d >> 0x20,parent);
  }
  QPersistentModelIndex::operator=(pQVar2,&local_58);
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
  local_58._0_8_ = (void *)0x0;
  local_58.i = (quintptr)&local_98;
  local_58.m.ptr = (QAbstractItemModel *)&local_78;
  QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,1,(void **)&local_58);
  QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
  local_58._0_8_ = (Data *)0x0;
  local_58.i = (quintptr)&local_98;
  local_58.m.ptr = (QAbstractItemModel *)&local_78;
  QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,2,(void **)&local_58);
  iVar8 = QPersistentModelIndex::column(pQVar2);
  if (iVar8 != local_78.d._4_4_) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
    local_58._0_8_ = (Data *)0x0;
    local_58.i = (quintptr)&local_98;
    local_58.m.ptr = (QAbstractItemModel *)&local_78;
    QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,3,(void **)&local_58);
  }
LAB_0045a7aa:
  local_78.d = (Data *)0x0;
  local_78.ptr = (QItemSelectionRange *)0x0;
  local_78.size = 0;
  local_98.size = 0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (QItemSelectionRange *)0x0;
  abegin = QList<QItemSelectionRange>::begin(&this_00->super_QList<QItemSelectionRange>);
  pQVar1 = &this->model;
  bVar7 = false;
LAB_0045a800:
  do {
    iVar10 = QList<QItemSelectionRange>::end(&this_00->super_QList<QItemSelectionRange>);
    if (abegin.i == iVar10.i) {
      QtPrivate::QCommonArrayOps<QItemSelectionRange>::growAppend
                ((QCommonArrayOps<QItemSelectionRange> *)this_00,local_98.ptr,
                 local_98.ptr + local_98.size);
      if (local_78.size != 0 || bVar7) {
        local_b8._0_8_ = (Data *)0x0;
        local_b8.i = 0;
        local_b8.m.ptr = (QAbstractItemModel *)0x0;
        local_58._0_8_ = (Data *)0x0;
        local_58.i = (quintptr)&local_b8;
        local_58.m.ptr = (QAbstractItemModel *)&local_78;
        QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,0,(void **)&local_58);
        QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer
                  ((QArrayDataPointer<QItemSelectionRange> *)&local_b8);
      }
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_98);
      QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_78);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return;
    }
    QPersistentModelIndex::parent(&local_58,&(abegin.i)->tl);
    if (((local_58.r != parent->r) || (local_58.c != parent->c)) ||
       (((QItemSelectionRange *)local_58.i != (QItemSelectionRange *)parent->i ||
        ((QArrayDataPointer<QItemSelectionRange> *)local_58.m.ptr !=
         (QArrayDataPointer<QItemSelectionRange> *)(parent->m).ptr)))) {
      local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
      local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
      QPersistentModelIndex::parent(&local_58,&(abegin.i)->tl);
      uVar12 = local_58.r;
      uVar5 = local_58._0_8_;
      pDVar6 = (Data *)local_58._0_8_;
      uVar11 = local_58.c;
      if (-1 < (local_58.c | local_58.r)) {
        while (local_58._0_8_ = pDVar6, uVar5 = local_58._0_8_,
              (QArrayDataPointer<QItemSelectionRange> *)local_58.m.ptr !=
              (QArrayDataPointer<QItemSelectionRange> *)0x0) {
          (*(code *)((Data *)((local_58.m.ptr)->super_QObject)._vptr_QObject)[6].super_QArrayData.
                    alloc)(&local_b8,local_58.m.ptr,&local_58);
          if ((((local_b8.r == parent->r) && (local_b8.c == parent->c)) &&
              ((QItemSelectionRange *)local_b8.i == (QItemSelectionRange *)parent->i)) &&
             ((QArrayDataPointer<QItemSelectionRange> *)local_b8.m.ptr ==
              (QArrayDataPointer<QItemSelectionRange> *)(parent->m).ptr)) {
            uVar12 = local_58.r;
            uVar5 = local_58._0_8_;
            uVar11 = local_58.c;
            break;
          }
          if ((QArrayDataPointer<QItemSelectionRange> *)local_58.m.ptr ==
              (QArrayDataPointer<QItemSelectionRange> *)0x0) {
            local_b8._0_8_ = (Data *)0xffffffffffffffff;
            local_b8.i = 0;
            local_b8.m.ptr = (QAbstractItemModel *)0x0;
          }
          else {
            (*(code *)((Data *)((local_58.m.ptr)->super_QObject)._vptr_QObject)[6].super_QArrayData.
                      alloc)(&local_b8,local_58.m.ptr,&local_58);
          }
          local_58.m.ptr = local_b8.m.ptr;
          local_58.r = local_b8.r;
          local_58.c = local_b8.c;
          uVar5 = local_58._0_8_;
          local_58.i = local_b8.i;
          local_58.r = local_b8.r;
          local_58.c = local_b8.c;
          uVar12 = local_58.r;
          uVar11 = local_58.c;
          if ((local_58.r < 0) || (pDVar6 = (Data *)local_b8._0_8_, (long)local_b8._0_8_ < 0))
          break;
        }
      }
      local_58._0_8_ = uVar5;
      if ((-1 < (int)uVar12) &&
         ((-1 < (int)uVar11 &&
          ((QArrayDataPointer<QItemSelectionRange> *)local_58.m.ptr !=
           (QArrayDataPointer<QItemSelectionRange> *)0x0)))) {
        if ((int)uVar12 <= end && start <= (int)uVar12) {
          QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                    ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,abegin.i);
          QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
          abegin = QList<QItemSelectionRange>::erase
                             (&this_00->super_QList<QItemSelectionRange>,abegin.i,abegin.i + 1);
          goto LAB_0045a800;
        }
        bVar7 = (bool)(bVar7 | end < (int)uVar12);
      }
LAB_0045aca6:
      abegin.i = abegin.i + 1;
      goto LAB_0045a800;
    }
    pQVar2 = &(abegin.i)->br;
    iVar8 = QPersistentModelIndex::row(pQVar2);
    if ((((iVar8 < start) || (iVar8 = QPersistentModelIndex::row(pQVar2), end < iVar8)) ||
        (iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl), iVar8 < start)) ||
       (iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl), end < iVar8)) {
      iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl);
      if ((iVar8 < start) || (iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl), end < iVar8)) {
        iVar8 = QPersistentModelIndex::row(pQVar2);
        if ((iVar8 < start) || (iVar8 = QPersistentModelIndex::row(pQVar2), end < iVar8)) {
          iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl);
          if ((iVar8 < start) && (iVar8 = QPersistentModelIndex::row(pQVar2), end < iVar8)) {
            local_e8.tl.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            local_e8.br.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
            QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::value(pQVar1);
            pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
            uVar12 = QPersistentModelIndex::column(&(abegin.i)->tl);
            QPersistentModelIndex::parent(&local_b8,&(abegin.i)->tl);
            (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                      (&local_58,pQVar13,CONCAT44(in_register_00000014,start),(ulong)uVar12,
                       &local_b8);
            QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
            ::value(pQVar1);
            pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
            uVar12 = QPersistentModelIndex::column(pQVar2);
            QPersistentModelIndex::parent(&local_108,&(abegin.i)->tl);
            (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                      (&local_d0,pQVar13,(ulong)(uint)end,(ulong)uVar12,&local_108);
            QItemSelectionRange::QItemSelectionRange(&local_e8,&local_58,&local_d0);
            QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
                      ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,&local_e8);
            QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
            QItemSelection::split(abegin.i,&local_e8,(QItemSelection *)&local_98);
            abegin = QList<QItemSelectionRange>::erase
                               (&this_00->super_QList<QItemSelectionRange>,abegin.i,abegin.i + 1);
            QPersistentModelIndex::~QPersistentModelIndex(&local_e8.br);
            QPersistentModelIndex::~QPersistentModelIndex(&local_e8.tl);
          }
          else {
            iVar8 = QPersistentModelIndex::row(&(abegin.i)->tl);
            abegin.i = abegin.i + 1;
            bVar7 = (bool)(bVar7 | end < iVar8);
          }
          goto LAB_0045a800;
        }
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar12 = QPersistentModelIndex::column(&(abegin.i)->tl);
        QPersistentModelIndex::parent(&local_b8,&(abegin.i)->tl);
        (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                  (&local_58,pQVar13,CONCAT44(in_register_00000014,start),(ulong)uVar12,&local_b8);
        QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_108,&local_58,&local_d0);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,
                   (QItemSelectionRange *)&local_108);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&(abegin.i)->tl);
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar12 = QPersistentModelIndex::column(pQVar2);
        QPersistentModelIndex::parent(&local_d0,&(abegin.i)->tl);
        (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar13,(ulong)(start - 1),(ulong)uVar12,&local_d0);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_108,&local_58,&local_b8);
        pQVar3 = ((abegin.i)->tl).d;
        pQVar4 = ((abegin.i)->br).d;
        ((abegin.i)->tl).d = (QPersistentModelIndexData *)local_108._0_8_;
        ((abegin.i)->br).d = (QPersistentModelIndexData *)local_108.i;
        local_108._0_8_ = pQVar3;
        local_108.i = (quintptr)pQVar4;
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108.i);
      }
      else {
        QPersistentModelIndex::operator_cast_to_QModelIndex(&(abegin.i)->tl);
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar12 = QPersistentModelIndex::column(pQVar2);
        QPersistentModelIndex::parent(&local_d0,&(abegin.i)->tl);
        (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                  (&local_b8,pQVar13,(ulong)(uint)end,(ulong)uVar12,&local_d0);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_108,&local_58,&local_b8);
        QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange>
                  ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,
                   (QItemSelectionRange *)&local_108);
        QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108.i);
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108);
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar13 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar12 = QPersistentModelIndex::column(&(abegin.i)->tl);
        QPersistentModelIndex::parent(&local_b8,&(abegin.i)->tl);
        (*(pQVar13->super_QObject)._vptr_QObject[0xc])
                  (&local_58,pQVar13,(ulong)(end + 1),(ulong)uVar12,&local_b8);
        QPersistentModelIndex::operator_cast_to_QModelIndex(pQVar2);
        QItemSelectionRange::QItemSelectionRange
                  ((QItemSelectionRange *)&local_108,&local_58,&local_d0);
        pQVar3 = ((abegin.i)->tl).d;
        pQVar4 = ((abegin.i)->br).d;
        ((abegin.i)->tl).d = (QPersistentModelIndexData *)local_108._0_8_;
        ((abegin.i)->br).d = (QPersistentModelIndexData *)local_108.i;
        local_108._0_8_ = pQVar3;
        local_108.i = (quintptr)pQVar4;
        QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108.i);
      }
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_108);
      goto LAB_0045aca6;
    }
    QtPrivate::QMovableArrayOps<QItemSelectionRange>::emplace<QItemSelectionRange_const&>
              ((QMovableArrayOps<QItemSelectionRange> *)&local_78,local_78.size,abegin.i);
    QList<QItemSelectionRange>::end((QList<QItemSelectionRange> *)&local_78);
    abegin = QList<QItemSelectionRange>::erase
                       (&this_00->super_QList<QItemSelectionRange>,abegin.i,abegin.i + 1);
  } while( true );
}

Assistant:

void QItemSelectionModelPrivate::rowsAboutToBeRemoved(const QModelIndex &parent,
                                                         int start, int end)
{
    Q_Q(QItemSelectionModel);
    Q_ASSERT(start <= end);
    finalize();

    // update current index
    if (currentIndex.isValid() && parent == currentIndex.parent()
        && currentIndex.row() >= start && currentIndex.row() <= end) {
        QModelIndex old = currentIndex;
        if (start > 0) {
            // there are rows left above the change
            currentIndex = model->index(start - 1, old.column(), parent);
        } else if (model.value() && end < model->rowCount(parent) - 1) {
            // there are rows left below the change
            currentIndex = model->index(end + 1, old.column(), parent);
        } else {
            // there are no rows left in the table
            currentIndex = QModelIndex();
        }
        emit q->currentChanged(currentIndex, old);
        emit q->currentRowChanged(currentIndex, old);
        if (currentIndex.column() != old.column())
            emit q->currentColumnChanged(currentIndex, old);
    }

    QItemSelection deselected;
    QItemSelection newParts;
    bool indexesOfSelectionChanged = false;
    QItemSelection::iterator it = ranges.begin();
    while (it != ranges.end()) {
        if (it->topLeft().parent() != parent) {  // Check parents until reaching root or contained in range
            QModelIndex itParent = it->topLeft().parent();
            while (itParent.isValid() && itParent.parent() != parent)
                itParent = itParent.parent();

            if (itParent.isValid() && start <= itParent.row() && itParent.row() <= end) {
                deselected.append(*it);
                it = ranges.erase(it);
            } else {
                if (itParent.isValid() && end < itParent.row())
                    indexesOfSelectionChanged = true;
                ++it;
            }
        } else if (start <= it->bottom() && it->bottom() <= end    // Full inclusion
                   && start <= it->top() && it->top() <= end) {
            deselected.append(*it);
            it = ranges.erase(it);
        } else if (start <= it->top() && it->top() <= end) {      // Top intersection
            deselected.append(QItemSelectionRange(it->topLeft(), model->index(end, it->right(), it->parent())));
            *it = QItemSelectionRange(model->index(end + 1, it->left(), it->parent()), it->bottomRight());
            ++it;
        } else if (start <= it->bottom() && it->bottom() <= end) {    // Bottom intersection
            deselected.append(QItemSelectionRange(model->index(start, it->left(), it->parent()), it->bottomRight()));
            *it = QItemSelectionRange(it->topLeft(), model->index(start - 1, it->right(), it->parent()));
            ++it;
        } else if (it->top() < start && end < it->bottom()) { // Middle intersection
            // If the parent contains (1, 2, 3, 4, 5, 6, 7, 8) and [3, 4, 5, 6] is selected,
            // and [4, 5] is removed, we need to split [3, 4, 5, 6] into [3], [4, 5] and [6].
            // [4, 5] is appended to deselected, and [3] and [6] remain part of the selection
            // in ranges.
            const QItemSelectionRange removedRange(model->index(start, it->left(), it->parent()),
                                                    model->index(end, it->right(), it->parent()));
            deselected.append(removedRange);
            QItemSelection::split(*it, removedRange, &newParts);
            it = ranges.erase(it);
        } else if (end < it->top()) { // deleted row before selection
            indexesOfSelectionChanged = true;
            ++it;
        } else {
            ++it;
        }
    }
    ranges.append(newParts);

    if (!deselected.isEmpty() || indexesOfSelectionChanged)
        emit q->selectionChanged(QItemSelection(), deselected);
}